

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

void __thiscall
VulkanHppGenerator::readVideoProfiles
          (VulkanHppGenerator *this,XMLElement *element,VideoCodec *videoCodec)

{
  pointer *this_00;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __l_00;
  int iVar1;
  bool bVar2;
  pointer ppVar3;
  reference ppXVar4;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_470;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_438;
  allocator<char> local_3f9;
  undefined1 local_3f8 [8];
  string value;
  XMLElement *child;
  iterator __end1;
  iterator __begin1;
  vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_> *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  _Self local_338;
  _Self local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  __normal_iterator<VulkanHppGenerator::VideoProfiles_*,_std::vector<VulkanHppGenerator::VideoProfiles,_std::allocator<VulkanHppGenerator::VideoProfiles>_>_>
  local_2a8;
  __normal_iterator<VulkanHppGenerator::VideoProfiles_*,_std::vector<VulkanHppGenerator::VideoProfiles,_std::allocator<VulkanHppGenerator::VideoProfiles>_>_>
  local_2a0;
  allocator<char> local_291;
  key_type local_290;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  undefined1 local_268 [8];
  VideoProfiles profiles;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [64];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_1b8;
  undefined1 local_180 [8];
  vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_> children;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_137;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_136;
  undefined1 local_135;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  undefined1 local_98 [64];
  undefined1 local_58 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  attributes;
  int line;
  VideoCodec *videoCodec_local;
  XMLElement *element_local;
  VulkanHppGenerator *this_local;
  
  attributes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       tinyxml2::XMLNode::GetLineNum(&element->super_XMLNode);
  getAttributes_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_58,element);
  iVar1 = attributes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
  local_135 = 1;
  local_128._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_128._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_128._M_t._M_impl._0_8_ = 0;
  local_128._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_f0 = &local_e8;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&local_128);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::pair<const_char_(&)[7],_true>(&local_e8,(char (*) [7])0x2c370d,&local_128);
  local_135 = 0;
  local_98._0_8_ = &local_e8;
  local_98._8_8_ = 1;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::allocator(&local_137);
  __l_00._M_len = local_98._8_8_;
  __l_00._M_array = (iterator)local_98._0_8_;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)(local_98 + 0x10),__l_00,&local_136,&local_137);
  children.
  super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &children.
             super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)this_00);
  checkAttributes(iVar1,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_58,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)(local_98 + 0x10),
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)this_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *)&children.
             super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *)(local_98 + 0x10));
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~allocator(&local_137);
  local_438 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_98;
  do {
    local_438 = local_438 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~pair(local_438);
  } while (local_438 != &local_e8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_128);
  getChildElements<tinyxml2::XMLElement>
            ((vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_> *)
             local_180,element);
  iVar1 = attributes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
  local_1b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_1b8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_1b8._M_t._M_impl._0_8_ = 0;
  local_1b8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1b8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map(&local_1b8);
  profiles.members.
  super__Vector_base<VulkanHppGenerator::VideoProfileMember,_std::allocator<VulkanHppGenerator::VideoProfileMember>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"videoprofilemember",
             (allocator<char> *)
             ((long)&profiles.members.
                     super__Vector_base<VulkanHppGenerator::VideoProfileMember,_std::allocator<VulkanHppGenerator::VideoProfileMember>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  profiles.members.
  super__Vector_base<VulkanHppGenerator::VideoProfileMember,_std::allocator<VulkanHppGenerator::VideoProfileMember>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_1f8._0_8_ = &local_218;
  local_1f8._8_8_ = 1;
  this_01 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&profiles.members.
                       super__Vector_base<VulkanHppGenerator::VideoProfileMember,_std::allocator<VulkanHppGenerator::VideoProfileMember>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_01);
  __l._M_len = local_1f8._8_8_;
  __l._M_array = (iterator)local_1f8._0_8_;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)(local_1f8 + 0x10),__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        ((long)&profiles.members.
                super__Vector_base<VulkanHppGenerator::VideoProfileMember,_std::allocator<VulkanHppGenerator::VideoProfileMember>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 5),this_01);
  checkElements(iVar1,(vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                       *)local_180,&local_1b8,
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1f8 + 0x10));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(local_1f8 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&profiles.members.
                        super__Vector_base<VulkanHppGenerator::VideoProfileMember,_std::allocator<VulkanHppGenerator::VideoProfileMember>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_470 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8;
  do {
    local_470 = local_470 + -1;
    std::__cxx11::string::~string((string *)local_470);
  } while (local_470 != &local_218);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&profiles.members.
                     super__Vector_base<VulkanHppGenerator::VideoProfileMember,_std::allocator<VulkanHppGenerator::VideoProfileMember>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~map(&local_1b8);
  VideoProfiles::VideoProfiles((VideoProfiles *)local_268);
  local_268._0_4_ = attributes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"struct",&local_291);
  local_270._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_58,&local_290);
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_270);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&profiles,
             &ppVar3->second);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  local_2a0._M_current =
       (VideoProfiles *)
       anon_unknown.dwarf_b1723::findByName<VulkanHppGenerator::VideoProfiles>
                 (&videoCodec->profiles,&profiles);
  local_2a8._M_current =
       (VideoProfiles *)
       std::
       vector<VulkanHppGenerator::VideoProfiles,_std::allocator<VulkanHppGenerator::VideoProfiles>_>
       ::end(&videoCodec->profiles);
  bVar2 = __gnu_cxx::
          operator==<VulkanHppGenerator::VideoProfiles_*,_std::vector<VulkanHppGenerator::VideoProfiles,_std::allocator<VulkanHppGenerator::VideoProfiles>_>_>
                    (&local_2a0,&local_2a8);
  iVar1 = attributes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
  std::operator+(&local_328,"Video Profiles struct <",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&profiles);
  std::operator+(&local_308,&local_328,"> already listed for Video Codec <");
  std::operator+(&local_2e8,&local_308,&videoCodec->name);
  std::operator+(&local_2c8,&local_2e8,">");
  checkForError(bVar2,iVar1,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_328);
  local_330._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
       ::find(&this->m_structs,(key_type *)&profiles);
  local_338._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
       ::end(&this->m_structs);
  bVar2 = std::operator==(&local_330,&local_338);
  iVar1 = attributes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 "Unknown Video Profiles struct <",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&profiles);
  std::operator+(&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 "> used with VideoCodec <");
  std::operator+(&local_378,&local_398,&videoCodec->name);
  std::operator+(&local_358,&local_378,">");
  checkForError(!bVar2,iVar1,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&__range1);
  std::vector<VulkanHppGenerator::VideoProfiles,_std::allocator<VulkanHppGenerator::VideoProfiles>_>
  ::push_back(&videoCodec->profiles,(value_type *)local_268);
  __end1 = std::vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
           ::begin((vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                    *)local_180);
  child = (XMLElement *)
          std::vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>::
          end((vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_> *
              )local_180);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_tinyxml2::XMLElement_**,_std::vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>_>
                      (&__end1,(__normal_iterator<const_tinyxml2::XMLElement_**,_std::vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>_>
                                *)&child);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      VideoProfiles::~VideoProfiles((VideoProfiles *)local_268);
      std::vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>::
      ~vector((vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_> *
              )local_180);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_58);
      return;
    }
    ppXVar4 = __gnu_cxx::
              __normal_iterator<const_tinyxml2::XMLElement_**,_std::vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>_>
              ::operator*(&__end1);
    value.field_2._8_8_ = *ppXVar4;
    __s = tinyxml2::XMLNode::Value((XMLNode *)value.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_3f8,__s,&local_3f9);
    std::allocator<char>::~allocator(&local_3f9);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_3f8,"videoprofilemember");
    if (!bVar2) break;
    readVideoProfileMember(this,(XMLElement *)value.field_2._8_8_,videoCodec);
    std::__cxx11::string::~string((string *)local_3f8);
    __gnu_cxx::
    __normal_iterator<const_tinyxml2::XMLElement_**,_std::vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>_>
    ::operator++(&__end1);
  }
  __assert_fail("value == \"videoprofilemember\"",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                ,0x410d,
                "void VulkanHppGenerator::readVideoProfiles(const tinyxml2::XMLElement *, VideoCodec &)"
               );
}

Assistant:

void VulkanHppGenerator::readVideoProfiles( tinyxml2::XMLElement const * element, VideoCodec & videoCodec )
{
  const int                          line       = element->GetLineNum();
  std::map<std::string, std::string> attributes = getAttributes( element );
  checkAttributes( line, attributes, { { "struct", {} } }, {} );

  std::vector<tinyxml2::XMLElement const *> children = getChildElements( element );
  checkElements( line, children, {}, { "videoprofilemember" } );

  VideoProfiles profiles;
  profiles.xmlLine = line;
  profiles.name    = attributes.find( "struct" )->second;

  checkForError( findByName( videoCodec.profiles, profiles.name ) == videoCodec.profiles.end(),
                 line,
                 "Video Profiles struct <" + profiles.name + "> already listed for Video Codec <" + videoCodec.name + ">" );
  checkForError( m_structs.find( profiles.name ) != m_structs.end(),
                 line,
                 "Unknown Video Profiles struct <" + profiles.name + "> used with VideoCodec <" + videoCodec.name + ">" );

  videoCodec.profiles.push_back( profiles );

  for ( auto child : children )
  {
    std::string value = child->Value();
    assert( value == "videoprofilemember" );
    readVideoProfileMember( child, videoCodec );
  }
}